

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_coding.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint64_t auStack_1d8 [24];
  uint64_t *local_118;
  undefined8 local_108;
  uint64_t encoded_cmp [24];
  uint8_t decoded [3];
  unsigned_long __vla_expr0;
  undefined2 local_2b;
  undefined1 local_29;
  size_t sStack_28;
  uint8_t msg [3];
  size_t l;
  uint64_t q_half;
  uint64_t q;
  
  sStack_28 = 0x18;
  local_118 = auStack_1d8;
  local_2b._0_1_ = 'c';
  local_2b._1_1_ = 0xa7;
  local_29 = 0xd4;
  local_108 = 0;
  encoded_cmp[0] = 0x5910f04084d75;
  encoded_cmp[1] = 0x5910f04084d75;
  encoded_cmp[2] = 0;
  encoded_cmp[3] = 0;
  encoded_cmp[4] = 0;
  encoded_cmp[5] = 0x5910f04084d75;
  encoded_cmp[6] = 0x5910f04084d75;
  encoded_cmp[7] = 0x5910f04084d75;
  encoded_cmp[8] = 0;
  encoded_cmp[9] = 0x5910f04084d75;
  encoded_cmp[10] = 0;
  encoded_cmp[0xb] = 0;
  encoded_cmp[0xc] = 0x5910f04084d75;
  encoded_cmp[0xd] = 0x5910f04084d75;
  encoded_cmp[0xe] = 0x5910f04084d75;
  encoded_cmp[0xf] = 0x5910f04084d75;
  encoded_cmp[0x10] = 0x5910f04084d75;
  encoded_cmp[0x11] = 0;
  encoded_cmp[0x12] = 0x5910f04084d75;
  encoded_cmp[0x13] = 0;
  encoded_cmp[0x14] = 0x5910f04084d75;
  encoded_cmp[0x15] = 0;
  encoded_cmp[0x16] = 0;
  iVar1 = encode((uint8_t *)&local_2b,local_118,0x18,0xb221e08109aeb);
  if ((((iVar1 == 0) && (iVar1 = memcmp(local_118,&local_108,sStack_28 << 3), iVar1 == 0)) &&
      (iVar1 = decode(local_118,(uint8_t *)((long)encoded_cmp + 0xbd),sStack_28,0xb221e08109aeb),
      iVar1 == 0)) && (iVar1 = memcmp((void *)((long)encoded_cmp + 0xbd),&local_2b,3), iVar1 == 0))
  {
    memset(local_118,0,sStack_28 << 3);
    memset((void *)((long)encoded_cmp + 0xbd),0,3);
    iVar1 = encode((uint8_t *)&local_2b,local_118,0xf,0xb221e08109aeb);
    if (((iVar1 == 0) && (iVar1 = memcmp(local_118,&local_108,0x78), iVar1 == 0)) &&
       ((local_118[0x10] == 0 &&
        ((iVar1 = decode(local_118,(uint8_t *)((long)encoded_cmp + 0xbd),0xf,0xb221e08109aeb),
         iVar1 == 0 &&
         (local_2b = CONCAT11(local_2b._1_1_,(uint8_t)local_2b) & 0xfeff,
         encoded_cmp[0x17]._5_2_ == local_2b)))))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int main() {

    uint64_t q = 3133737123486443;
    uint64_t q_half = 1566868561743221;
    size_t l = 3*8;
    uint8_t msg[3];
    uint64_t encoded[l];
    uint8_t decoded[3];

    // test encode / decode with 3 byte message

    msg[0] = 0x63;
    msg[1] = 0xA7;
    msg[2] = 0xD4;
    uint64_t encoded_cmp[] = {0, q_half, q_half, 0, 0, 0, q_half, q_half, q_half, 0, q_half, 0, 0, q_half, q_half, q_half, q_half, q_half ,0, q_half, 0, q_half, 0, 0};

    if(encode(msg, encoded, l, q) != 0)
        goto error;

    if(memcmp(encoded, encoded_cmp, l * sizeof(uint64_t)) != 0)
        goto error;

    if(decode(encoded, decoded, l, q) != 0)
        goto error;

    if(memcmp(decoded, msg, 3) != 0)
        goto error;

    // now test with an odd number of bits

    memset(encoded, 0, l * sizeof(uint64_t));
    memset(decoded, 0, 3);

    if(encode(msg, encoded, 15, q) != 0)
        goto error;

    if(memcmp(encoded, encoded_cmp, 15 * sizeof(uint64_t)) != 0 || encoded[16] != 0)
        goto error;

    if(decode(encoded, decoded, 15, q) != 0)
        goto error;

    msg[1] &= 0xFE;
    if(memcmp(decoded, msg, 2) != 0)
        goto error;

    return 0;


    error:
        return 1;

}